

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O2

int h264_total_zeros(bitstream *str,int mode,int tzVlcIndex,uint32_t *val)

{
  int iVar1;
  vs_vlc_val **ppvVar2;
  
  if (mode == 2) {
    ppvVar2 = total_zeros_c2_tab;
  }
  else if (mode == 1) {
    ppvVar2 = total_zeros_c1_tab;
  }
  else {
    if (mode != 0) {
      abort();
    }
    ppvVar2 = total_zeros_tab;
  }
  iVar1 = vs_vlc(str,val,ppvVar2[tzVlcIndex]);
  return (int)(iVar1 != 0);
}

Assistant:

int h264_total_zeros(struct bitstream *str, int mode, int tzVlcIndex, uint32_t *val) {
	const struct vs_vlc_val *tab;
	switch (mode) {
		case 0:
			tab = total_zeros_tab[tzVlcIndex];
			break;
		case 1:
			tab = total_zeros_c1_tab[tzVlcIndex];
			break;
		case 2:
			tab = total_zeros_c2_tab[tzVlcIndex];
			break;
		default:
			abort();
	}
	if (vs_vlc(str, val, tab)) return 1;
	return 0;
}